

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrimmedSurfaceClipping.h
# Opt level: O0

void __thiscall
anurbs::TrimmedSurfaceClipping::compute_span
          (TrimmedSurfaceClipping *this,Index index_u,Index index_v,Interval span_u,Interval span_v)

{
  value_type pPVar1;
  pointer pMVar2;
  bool bVar3;
  int iVar4;
  reference pvVar5;
  Path *pPVar6;
  TrimTypes *pTVar7;
  vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_> *pvVar8;
  size_type sVar9;
  pointer *this_00;
  pointer pMVar10;
  const_reference ppPVar11;
  double dVar12;
  double dVar13;
  IntPoint IVar14;
  bool local_43d;
  undefined1 local_388 [24];
  IntPoint *pt_1;
  iterator __end5;
  iterator __begin5;
  Path *__range5;
  Path inner_path;
  size_t i;
  reference local_320;
  IntPoint *pt;
  const_iterator __end4;
  const_iterator __begin4;
  Path *__range4;
  Polygon region;
  PolyNodes *inner_contours;
  Path *outer_contour;
  byte local_2a9;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_2a8;
  byte local_289;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_288;
  pointer *local_270;
  Path *contour;
  initializer_list<anurbs::Polygon> local_260;
  undefined1 local_250 [8];
  vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_> regions;
  PolyNode *polynode;
  Clipper clipper;
  IntPoint local_108;
  IntPoint local_f8;
  IntPoint local_e8;
  undefined1 local_d8 [8];
  PolyTree polytree;
  allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_> local_59;
  undefined1 local_58 [8];
  Paths clip;
  Index index_v_local;
  Index index_u_local;
  TrimmedSurfaceClipping *this_local;
  Interval span_v_local;
  Interval span_u_local;
  
  span_v_local.m_t0 = span_v.m_t1;
  this_local = (TrimmedSurfaceClipping *)span_v.m_t0;
  span_v_local.m_t1 = span_u.m_t0;
  clip.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)index_v;
  std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>::
  allocator(&local_59);
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::vector((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            *)local_58,1,&local_59);
  std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>::
  ~allocator(&local_59);
  ClipperLib::PolyTree::PolyTree((PolyTree *)local_d8);
  pvVar5 = std::
           vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           ::operator[]((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                         *)local_58,0);
  dVar12 = Interval::t0((Interval *)&span_v_local.m_t1);
  dVar13 = Interval::t0((Interval *)&this_local);
  local_e8 = to_int_pt(this,dVar12,dVar13);
  pPVar6 = ClipperLib::operator<<(pvVar5,&local_e8);
  dVar12 = Interval::t1((Interval *)&span_v_local.m_t1);
  dVar13 = Interval::t0((Interval *)&this_local);
  local_f8 = to_int_pt(this,dVar12,dVar13);
  pPVar6 = ClipperLib::operator<<(pPVar6,&local_f8);
  dVar12 = Interval::t1((Interval *)&span_v_local.m_t1);
  dVar13 = Interval::t1((Interval *)&this_local);
  local_108 = to_int_pt(this,dVar12,dVar13);
  pPVar6 = ClipperLib::operator<<(pPVar6,&local_108);
  dVar12 = Interval::t0((Interval *)&span_v_local.m_t1);
  dVar13 = Interval::t1((Interval *)&this_local);
  IVar14 = to_int_pt(this,dVar12,dVar13);
  clipper._272_8_ = IVar14.X;
  ClipperLib::operator<<(pPVar6,(IntPoint *)&clipper.field_0x110);
  ClipperLib::Clipper::Clipper((Clipper *)&polynode,0);
  ClipperLib::ClipperBase::AddPaths
            ((ClipperBase *)((long)&polynode + (long)polynode[-1].Parent),&this->m_paths,ptSubject,
             true);
  ClipperLib::ClipperBase::AddPaths
            ((ClipperBase *)((long)&polynode + (long)polynode[-1].Parent),(Paths *)local_58,ptClip,
             true);
  ClipperLib::Clipper::Execute
            ((Clipper *)&polynode,ctIntersection,(PolyTree *)local_d8,pftNonZero,pftNonZero);
  regions.super__Vector_base<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)ClipperLib::PolyTree::GetFirst((PolyTree *)local_d8);
  std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>::vector
            ((vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_> *)local_250);
  iVar4 = ClipperLib::PolyTree::Total((PolyTree *)local_d8);
  if (iVar4 == 0) {
    pTVar7 = span_trim_type(this,index_u,
                            (Index)clip.
                                   super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    *pTVar7 = Empty;
    std::initializer_list<anurbs::Polygon>::initializer_list(&local_260);
    pvVar8 = span_polygons(this,index_u,
                           (Index)clip.
                                  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>::operator=(pvVar8,local_260);
    contour._4_4_ = 1;
  }
  else {
    iVar4 = ClipperLib::PolyTree::Total((PolyTree *)local_d8);
    if (iVar4 == 1) {
      local_270 = &((regions.super__Vector_base<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage)->outer_path).
                   super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      sVar9 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::size
                        ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                         local_270);
      local_289 = 0;
      local_2a9 = 0;
      local_43d = false;
      if (sVar9 == 4) {
        pvVar5 = std::
                 vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                 ::operator[]((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                               *)local_58,0);
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
                  (&local_288,pvVar5);
        local_289 = 1;
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
                  (&local_2a8,
                   (vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)local_270)
        ;
        local_2a9 = 1;
        local_43d = is_rect(&local_288,&local_2a8);
      }
      if ((local_2a9 & 1) != 0) {
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector
                  (&local_2a8);
      }
      if ((local_289 & 1) != 0) {
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector
                  (&local_288);
      }
      if (local_43d != false) {
        pTVar7 = span_trim_type(this,index_u,
                                (Index)clip.
                                       super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        *pTVar7 = Full;
        std::initializer_list<anurbs::Polygon>::initializer_list
                  ((initializer_list<anurbs::Polygon> *)&outer_contour);
        pvVar8 = span_polygons(this,index_u,
                               (Index)clip.
                                      super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>::operator=
                  (pvVar8,_outer_contour);
        contour._4_4_ = 1;
        goto LAB_002f761d;
      }
    }
    while (regions.super__Vector_base<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      bVar3 = ClipperLib::PolyNode::IsHole
                        ((PolyNode *)
                         regions.
                         super__Vector_base<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar3) {
        this_00 = &((regions.super__Vector_base<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage)->outer_path).
                   super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        region.inner_paths.
        super__Vector_base<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)&((regions.
                         super__Vector_base<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage)->inner_paths).
                       super__Vector_base<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
        Polygon::Polygon((Polygon *)&__range4);
        sVar9 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::size
                          ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                           this_00);
        std::
        vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
        ::reserve((vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                   *)&__range4,sVar9);
        __end4 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::begin
                           ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                            this_00);
        pt = (IntPoint *)
             std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::end
                       ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                        this_00);
        while( true ) {
          bVar3 = __gnu_cxx::operator!=
                            (&__end4,(__normal_iterator<const_ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                                      *)&pt);
          if (!bVar3) break;
          local_320 = __gnu_cxx::
                      __normal_iterator<const_ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                      ::operator*(&__end4);
          from_int_pt((TrimmedSurfaceClipping *)&i,(IntPoint *)this);
          std::
          vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
          ::push_back((vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                       *)&__range4,(value_type *)&i);
          __gnu_cxx::
          __normal_iterator<const_ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
          ::operator++(&__end4);
        }
        inner_path.
        super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        while( true ) {
          pMVar2 = inner_path.
                   super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pMVar10 = (pointer)std::
                             vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                             ::size((vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                     *)region.inner_paths.
                                       super__Vector_base<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (pMVar10 <= pMVar2) break;
          std::
          vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
          ::vector((vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                    *)&__range5);
          ppPVar11 = std::vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>::
                     operator[]((vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                 *)region.inner_paths.
                                   super__Vector_base<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (size_type)
                                inner_path.
                                super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar9 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::size
                            (&(*ppPVar11)->Contour);
          std::
          vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
          ::reserve((vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                     *)&__range5,sVar9);
          ppPVar11 = std::vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>::
                     operator[]((vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                 *)region.inner_paths.
                                   super__Vector_base<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (size_type)
                                inner_path.
                                super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pPVar1 = *ppPVar11;
          __end5 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::begin
                             (&pPVar1->Contour);
          pt_1 = (IntPoint *)
                 std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::end
                           (&pPVar1->Contour);
          while( true ) {
            bVar3 = __gnu_cxx::operator!=
                              (&__end5,(__normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                                        *)&pt_1);
            if (!bVar3) break;
            local_388._16_8_ =
                 __gnu_cxx::
                 __normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                 ::operator*(&__end5);
            from_int_pt((TrimmedSurfaceClipping *)local_388,(IntPoint *)this);
            std::
            vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
            ::push_back((vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                         *)&__range5,(value_type *)local_388);
            __gnu_cxx::
            __normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
            ::operator++(&__end5);
          }
          std::
          vector<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
          ::push_back((vector<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
                       *)&region.outer_path.
                          super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&__range5
                     );
          std::
          vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
          ::~vector((vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                     *)&__range5);
          inner_path.
          super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((long)((inner_path.
                                 super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                               super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).
                               m_storage.m_data.array + 1);
        }
        std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>::push_back
                  ((vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_> *)local_250,
                   (value_type *)&__range4);
        Polygon::~Polygon((Polygon *)&__range4);
      }
      regions.super__Vector_base<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)ClipperLib::PolyNode::GetNext
                              ((PolyNode *)
                               regions.
                               super__Vector_base<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    pTVar7 = span_trim_type(this,index_u,
                            (Index)clip.
                                   super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    *pTVar7 = trimmed;
    pvVar8 = span_polygons(this,index_u,
                           (Index)clip.
                                  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>::operator=
              (pvVar8,(vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_> *)local_250);
    contour._4_4_ = 0;
  }
LAB_002f761d:
  std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>::~vector
            ((vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_> *)local_250);
  ClipperLib::Clipper::~Clipper((Clipper *)&polynode);
  ClipperLib::PolyTree::~PolyTree((PolyTree *)local_d8);
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::~vector((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
             *)local_58);
  return;
}

Assistant:

void compute_span(const Index index_u, const Index index_v, const Interval span_u, const Interval span_v)
    {
        ClipperLib::Paths clip(1);
        ClipperLib::PolyTree polytree;

        clip[0] << to_int_pt(span_u.t0(), span_v.t0())
                << to_int_pt(span_u.t1(), span_v.t0())
                << to_int_pt(span_u.t1(), span_v.t1())
                << to_int_pt(span_u.t0(), span_v.t1());

        ClipperLib::Clipper clipper;
        clipper.AddPaths(m_paths, ClipperLib::ptSubject, true);
        clipper.AddPaths(clip, ClipperLib::ptClip, true);
        clipper.Execute(ClipperLib::ctIntersection, polytree,
            ClipperLib::pftNonZero, ClipperLib::pftNonZero);

        ClipperLib::PolyNode* polynode = polytree.GetFirst();

        std::vector<Polygon> regions;

        if (polytree.Total() == 0) {
            span_trim_type(index_u, index_v) = TrimTypes::Empty;
            span_polygons(index_u, index_v) = {};
            return;
        }

        if (polytree.Total() == 1) {
            const auto& contour = polynode->Contour;

            if (contour.size() == 4 && is_rect(clip[0], contour)) {
                span_trim_type(index_u, index_v) = TrimTypes::Full;
                span_polygons(index_u, index_v) = {};
                return;
            }
        }

        while (polynode) {
            if (!polynode->IsHole()) {
                const auto& outer_contour = polynode->Contour;
                const auto& inner_contours = polynode->Childs;

                Polygon region;

                region.outer_path.reserve(outer_contour.size());

                for (const auto& pt : outer_contour) {
                    region.outer_path.push_back(from_int_pt(pt));
                }

                for (std::size_t i = 0; i < inner_contours.size(); i++) {
                    typename Polygon::Path inner_path;

                    inner_path.reserve(inner_contours[i]->Contour.size());

                    for (const auto& pt : inner_contours[i]->Contour) {
                        inner_path.push_back(from_int_pt(pt));
                    }

                    region.inner_paths.push_back(inner_path);
                }

                regions.push_back(region);
            }

            polynode = polynode->GetNext();
        }

        span_trim_type(index_u, index_v) = TrimTypes::trimmed;
        span_polygons(index_u, index_v) = regions;
    }